

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigsf.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  bool bVar1;
  undefined8 __nptr;
  int iVar2;
  off_t i;
  long lVar3;
  int *piVar4;
  size_t sVar5;
  mapped_type *pmVar6;
  byte bVar7;
  uint uVar8;
  char *pcVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  char *endptr;
  string bytestr;
  uint8_t exe [268];
  string hexstring;
  char libname [4096];
  ulong local_21e8;
  ulong local_21d8;
  long local_21d0;
  char *local_21c8;
  char *local_21c0;
  long local_21b8;
  char *local_21b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_21a8;
  uint8_t local_2178 [4];
  undefined1 local_2174;
  undefined1 local_2173;
  undefined1 local_2172;
  undefined1 local_2171;
  undefined1 local_2170;
  undefined1 local_216f;
  undefined1 local_216e;
  undefined1 local_216d;
  undefined1 auStack_216c [260];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2068;
  key_type local_2038 [128];
  char local_1038 [4104];
  
  if (argc == 1) {
LAB_00104743:
    usage(*argv);
  }
  else {
    local_21c0 = (char *)0x0;
    iVar10 = 1;
    if (argc < 2) {
      pcVar9 = (char *)0x0;
      local_21c8 = (char *)0x0;
    }
    else {
      local_21c8 = (char *)0x0;
      pcVar9 = (char *)0x0;
      do {
        __s1 = argv[iVar10];
        if (*__s1 != '-') break;
        iVar2 = strcmp(__s1,"--help");
        if (iVar2 == 0) goto LAB_00104743;
        iVar2 = strcmp(__s1,"--psfby");
        if ((iVar2 == 0) || (iVar2 = strcmp(__s1,"--gsfby"), iVar2 == 0)) {
          if (argc <= iVar10 + 1) {
LAB_00104ebf:
            pcVar9 = "Error: Too few arguments for \"%s\"\n";
LAB_00104ee3:
            fprintf(_stderr,pcVar9,__s1);
            return 1;
          }
          local_21c8 = argv[iVar10 + 1];
        }
        else {
          iVar2 = strcmp(__s1,"-o");
          if (iVar2 != 0) {
            pcVar9 = "Error: Unknown option \"%s\"\n";
            goto LAB_00104ee3;
          }
          if (argc <= iVar10 + 1) goto LAB_00104ebf;
          pcVar9 = argv[iVar10 + 1];
        }
        iVar10 = iVar10 + 2;
      } while (iVar10 < argc);
    }
    if ((argc - iVar10) - 5U < 0xfffffffe) {
      main_cold_10();
    }
    else {
      local_21b0 = pcVar9;
      if (pcVar9 == (char *)0x0) {
        local_21b0 = argv[iVar10];
      }
      sprintf(local_1038,"%s.gsflib");
      lVar3 = strtol(argv[(long)iVar10 + 1],&local_21c0,0x10);
      if (((*local_21c0 == '\0') &&
          (local_21b8 = lVar3, piVar4 = __errno_location(), *piVar4 != 0x22)) && (-1 < local_21b8))
      {
        if (((uint)local_21b8 & 0xfffc0000) == 0x2000000 ||
            ((uint)local_21b8 & 0xfe000000) == 0x8000000) {
          local_21d0 = 1;
          if ((argc - iVar10 < 4) ||
             (((local_21d0 = strtol(argv[(long)iVar10 + 3],&local_21c0,10), *local_21c0 == '\0' &&
               (*piVar4 != 0x22)) && (-1 < local_21d0)))) {
            memset(local_2178,0,0x10c);
            pcVar9 = argv[(long)iVar10 + 2];
            if (*pcVar9 == '=') {
              local_2038[0]._M_dataplus._M_p = (pointer)&local_2038[0].field_2;
              sVar5 = strlen(pcVar9 + 1);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_2038,pcVar9 + 1,pcVar9 + sVar5 + 1);
              if ((local_2038[0]._M_string_length & 1) == 0) {
                local_21d8 = local_2038[0]._M_string_length >> 1;
                if (local_2038[0]._M_string_length < 0x202) {
                  bVar13 = local_2038[0]._M_string_length == 0;
                  if (bVar13) {
                    local_21e8 = 0;
                    uVar11 = 0;
                    uVar8 = 0;
                  }
                  else {
                    uVar8 = 0;
                    uVar12 = 0;
                    bVar13 = false;
                    uVar11 = 0;
                    local_21e8 = 0;
                    do {
                      std::__cxx11::string::substr((ulong)&local_21a8,(ulong)local_2038);
                      __nptr = local_21a8._M_impl._0_8_;
                      iVar10 = strcasecmp((char *)local_21a8._M_impl._0_8_,"NN");
                      if (iVar10 == 0) {
                        if (uVar11 == 0) {
                          bVar1 = true;
                          uVar11 = 1;
                          bVar13 = true;
                          local_21e8 = uVar12;
                        }
                        else if (bVar13) {
                          uVar11 = uVar11 + 1;
                          bVar1 = true;
                        }
                        else {
                          main_cold_5();
                          uVar8 = 1;
                          bVar1 = false;
                        }
                      }
                      else {
                        lVar3 = strtol((char *)__nptr,&local_21c0,0x10);
                        if ((*local_21c0 == '\0') && (*piVar4 != 0x22)) {
                          auStack_216c[uVar12] = (char)lVar3;
                          bVar1 = true;
                        }
                        else {
                          main_cold_4();
                          uVar8 = 1;
                          bVar1 = false;
                        }
                        bVar13 = false;
                      }
                      if ((_Base_ptr *)local_21a8._M_impl._0_8_ !=
                          &local_21a8._M_impl.super__Rb_tree_header._M_header._M_parent) {
                        operator_delete((void *)local_21a8._M_impl._0_8_,
                                        (ulong)((long)&(local_21a8._M_impl.super__Rb_tree_header.
                                                        _M_header._M_parent)->_M_color + 1));
                      }
                      if (!bVar1) {
                        bVar13 = false;
                        goto LAB_00104b1f;
                      }
                      uVar12 = uVar12 + 1;
                    } while (local_21d8 != uVar12);
                    bVar13 = true;
                  }
                }
                else {
                  main_cold_6();
                  uVar8 = 1;
                  bVar13 = false;
                  local_21e8 = 0;
                  uVar11 = 0;
                }
              }
              else {
                main_cold_3();
                uVar8 = 1;
                bVar13 = false;
                local_21e8 = 0;
                uVar11 = 0;
                local_21d8 = 0;
              }
LAB_00104b1f:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2038[0]._M_dataplus._M_p != &local_2038[0].field_2) {
                operator_delete(local_2038[0]._M_dataplus._M_p,
                                local_2038[0].field_2._M_allocated_capacity + 1);
              }
              iVar10 = (int)local_21d8;
              if (!bVar13) {
                return uVar8;
              }
            }
            else {
              uVar11 = strtol(pcVar9,&local_21c0,10);
              if (((*local_21c0 != '\0') || (*piVar4 == 0x22)) || ((long)uVar11 < 0)) {
                main_cold_2();
                return 1;
              }
              local_21e8 = 0;
              iVar10 = (int)uVar11;
            }
            if (uVar11 < 5) {
              local_2171 = (undefined1)((ulong)local_21b8 >> 0x18);
              local_2178[0] = '\0';
              local_2178[1] = '\0';
              local_2178[3] = 8;
              if (((uint)local_21b8 & 0xb000000) != 0x9000000) {
                local_2178[3] = local_2171;
              }
              local_2178[2] = 0;
              local_2174 = (undefined1)local_21b8;
              local_2173 = (undefined1)((ulong)local_21b8 >> 8);
              local_2172 = (undefined1)((ulong)local_21b8 >> 0x10);
              local_2170 = (undefined1)iVar10;
              local_216f = (undefined1)((uint)iVar10 >> 8);
              local_216e = (undefined1)((uint)iVar10 >> 0x10);
              local_216d = (undefined1)((uint)iVar10 >> 0x18);
              if ((uint)local_21d0 == 0) {
                return 0;
              }
              local_21b8 = CONCAT71(local_21b8._1_7_,uVar11 == 0 || (long)local_21e8 < 0);
              uVar8 = 0;
              iVar2 = 0;
              do {
                local_2038[0]._M_dataplus._M_p = (pointer)&local_2038[0].field_2;
                local_21a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                local_21a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_21a8._M_impl.super__Rb_tree_header._M_header._M_left =
                     (_Base_ptr)((long)&local_21a8 + 8);
                local_21a8._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_21a8._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_21a8._M_impl.super__Rb_tree_header._M_header._M_left;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_2038,"_lib","");
                pmVar6 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&local_21a8,local_2038);
                pcVar9 = (char *)pmVar6->_M_string_length;
                strlen(local_1038);
                std::__cxx11::string::_M_replace((ulong)pmVar6,0,pcVar9,(ulong)local_1038);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2038[0]._M_dataplus._M_p != &local_2038[0].field_2) {
                  operator_delete(local_2038[0]._M_dataplus._M_p,
                                  local_2038[0].field_2._M_allocated_capacity + 1);
                }
                if ((local_21c8 != (char *)0x0) && (*local_21c8 != '\0')) {
                  local_2038[0]._M_dataplus._M_p = (pointer)&local_2038[0].field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_2038,"gsfby","");
                  pmVar6 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&local_21a8,local_2038);
                  pcVar9 = (char *)pmVar6->_M_string_length;
                  strlen(local_21c8);
                  std::__cxx11::string::_M_replace((ulong)pmVar6,0,pcVar9,(ulong)local_21c8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2038[0]._M_dataplus._M_p != &local_2038[0].field_2) {
                    operator_delete(local_2038[0]._M_dataplus._M_p,
                                    local_2038[0].field_2._M_allocated_capacity + 1);
                  }
                }
                if ((uint)local_21d0 == 1) {
                  sprintf((char *)local_2038,"%s.minigsf",local_21b0);
                }
                else {
                  sprintf((char *)local_2038,"%s-%04d.minigsf",local_21b0);
                }
                if ((char)local_21b8 == '\0') {
                  bVar7 = 0;
                  uVar12 = 0;
                  do {
                    auStack_216c[uVar12 + local_21e8] = (char)(uVar8 >> (bVar7 & 0x1f));
                    uVar12 = uVar12 + 1;
                    bVar7 = bVar7 + 8;
                  } while (uVar11 != uVar12);
                }
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::_Rb_tree(&local_2068,&local_21a8);
                bVar13 = exe2gsf((char *)local_2038,local_2178,iVar10 + 0xc,
                                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_2068);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~_Rb_tree(&local_2068);
                if (bVar13) {
                  printf("Created %s\n",local_2038);
                }
                else {
                  printf("Error: Unable to create %s\n",local_2038);
                  iVar2 = iVar2 + 1;
                }
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~_Rb_tree(&local_21a8);
                uVar8 = uVar8 + 1;
              } while (uVar8 != (uint)local_21d0);
              return (uint)(iVar2 != 0);
            }
            main_cold_7();
          }
          else {
            main_cold_8();
          }
        }
        else {
          main_cold_1();
        }
      }
      else {
        main_cold_9();
      }
    }
  }
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
	if (argc == 1) {
		usage(argv[0]);
		return EXIT_FAILURE;
	}

	long longval;
	char *endptr = NULL;

	char *psfby = NULL;

	char *outname = NULL;

	int argi = 1;
	while (argi < argc && argv[argi][0] == '-') {
		if (strcmp(argv[argi], "--help") == 0) {
			usage(argv[0]);
			return EXIT_FAILURE;
		}
		else if (strcmp(argv[argi], "--psfby") == 0 || strcmp(argv[argi], "--gsfby") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			psfby = argv[argi + 1];
			argi++;
		}
		else if (strcmp(argv[argi], "-o") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			outname = argv[argi + 1];
			argi++;
		}
		else {
			fprintf(stderr, "Error: Unknown option \"%s\"\n", argv[argi]);
			return EXIT_FAILURE;
		}
		argi++;
	}

	int argnum = argc - argi;
	if (argnum < 3 || argnum > 4) {
		fprintf(stderr, "Error: Too few/more arguments\n");
		return EXIT_FAILURE;
	}

	char * gsf_basename = argv[argi];
	if (outname == NULL) outname = gsf_basename;

	char libname[PATH_MAX];
	sprintf(libname, "%s.gsflib", gsf_basename);

	longval = strtol(argv[argi + 1], &endptr, 16);
	if (*endptr != '\0' || errno == ERANGE || longval < 0) {
		fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 1]);
		return EXIT_FAILURE;
	}
	uint32_t load_offset = (uint32_t)longval;
	if (!((load_offset >= 0x8000000 && load_offset <= 0x9ffffff) || (load_offset >= 0x2000000 && load_offset <= 0x203ffff))) {
		fprintf(stderr, "Error: Load load_offset 0x%08X is out of range\n", load_offset);
		fprintf(stderr, "       Valid ranges are 0x8000000..0x9FFFFFF and 0x2000000..0x203FFFF (for multiboot ROM)\n");
		return EXIT_FAILURE;
	}

	uint32_t count = 1;
	if (argnum >= 4)
	{
		longval = strtol(argv[argi + 3], &endptr, 10);
		if (*endptr != '\0' || errno == ERANGE || longval < 0) {
			fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 3]);
			return EXIT_FAILURE;
		}
		count = (uint32_t)longval;
	}

	uint8_t exe[GSF_EXE_HEADER_SIZE + 256];
	memset(exe, 0, GSF_EXE_HEADER_SIZE + 256);

	off_t offset_of_num = 0;
	size_t size_of_num = 0;
	size_t romsize = 0;
	if (argv[argi + 2][0] == '=') {
		std::string hexstring(&argv[argi + 2][1]);

		if (hexstring.length() % 2 != 0) {
			fprintf(stderr, "Error: Hex string length error\n");
			return EXIT_FAILURE;
		}
		romsize = hexstring.length() / 2;
		if (romsize > 256) {
			fprintf(stderr, "Error: Output size error\n");
			return EXIT_FAILURE;
		}

		bool in_number = false;
		uint8_t * hex = &exe[GSF_EXE_HEADER_SIZE];
		for (off_t offset = 0; offset < (off_t)romsize; offset++) {
			std::string bytestr = hexstring.substr(offset * 2, 2);

			if (strcasecmp(bytestr.c_str(), "NN") == 0) {
				if (size_of_num == 0) {
					offset_of_num = offset;
					size_of_num = 1;
					in_number = true;
				}
				else {
					if (!in_number) {
						fprintf(stderr, "Error: Multiple number field\n");
						return EXIT_FAILURE;
					}
					size_of_num++;
				}
			}
			else {
				in_number = false;

				longval = strtol(bytestr.c_str(), &endptr, 16);
				if (*endptr != '\0' || errno == ERANGE) {
					fprintf(stderr, "Error: Number format error \"%s\"\n", bytestr.c_str());
					return EXIT_FAILURE;
				}

				hex[offset] = (uint8_t)longval;
			}
		}
	} else {
		longval = strtol(argv[argi + 2], &endptr, 10);
		if (*endptr != '\0' || errno == ERANGE || longval < 0) {
			fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 2]);
			return EXIT_FAILURE;
		}
		romsize = size_of_num = (size_t)longval;
	}

	if (size_of_num > 4) {
		fprintf(stderr, "Error: Output number size error\n");
		return EXIT_FAILURE;
	}

	uint32_t entrypoint = load_offset & 0xFF000000;
	if (entrypoint == 0x9000000)
		entrypoint = 0x8000000;
	writeInt(&exe[0], entrypoint);
	writeInt(&exe[4], load_offset);
	writeInt(&exe[8], (uint32_t)romsize);

	int num_error = 0;
	for (uint32_t num = 0; num < count; num++) {
		std::map<std::string, std::string> tags;
		tags["_lib"] = libname;

		if (psfby != NULL && strcmp(psfby, "") != 0) {
			tags["gsfby"] = psfby;
		}

		char gsf_path[PATH_MAX];
		if (count != 1)
			sprintf(gsf_path, "%s-%04d.minigsf", outname, num);
		else
			sprintf(gsf_path, "%s.minigsf", outname);

		// patch exe
		if (offset_of_num >= 0) {
			for (off_t i = 0; i < (off_t)size_of_num; i++) {
				exe[GSF_EXE_HEADER_SIZE + offset_of_num + i] = (num >> (8 * i)) & 0xff;
			}
		}

		if (exe2gsf(gsf_path, exe, GSF_EXE_HEADER_SIZE + (uint32_t)romsize, tags)) {
			printf("Created %s\n", gsf_path);
		}
		else {
			printf("Error: Unable to create %s\n", gsf_path);
			num_error++;
		}
	}

	return (num_error == 0) ? EXIT_SUCCESS : EXIT_FAILURE;
}